

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O0

unsigned_long query_int<unsigned_long,char_const(&)[19]>(char (*prompt) [19])

{
  unsigned_long local_1c8;
  unsigned_long res;
  istringstream local_1b0 [8];
  istringstream converter;
  string local_30 [8];
  string read_data;
  char (*prompt_local) [19];
  
  query_str<char_const(&)[19]>((char (*) [19])local_30);
  std::__cxx11::istringstream::istringstream(local_1b0,local_30,8);
  std::istream::operator>>((istream *)local_1b0,&local_1c8);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::__cxx11::string::~string(local_30);
  return local_1c8;
}

Assistant:

Integer query_int(T && prompt)
{
    const std::string read_data = query_str(std::forward<T>(prompt));

    std::istringstream converter(read_data);

    Integer res;

    converter >> res;

    return res;
}